

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O0

int __thiscall vkt::Draw::DrawIndexedTests::init(DrawIndexedTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int extraout_EAX;
  mapped_type *ppcVar2;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *pIVar3;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed> *pIVar4;
  TestSpecBase local_2d8;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  undefined1 local_249;
  TestSpecBase local_248;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  key_type local_1c0 [2];
  undefined1 local_1b8 [8];
  TestSpec testSpec_1;
  TestSpecBase local_178;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  undefined1 local_e9;
  TestSpecBase local_e8;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  key_type local_60 [5];
  key_type local_4c;
  undefined1 local_48 [8];
  TestSpec testSpec;
  DrawIndexedTests *this_local;
  
  testSpec._48_8_ = this;
  TestSpecBase::TestSpecBase((TestSpecBase *)local_48);
  local_4c = SHADERTYPE_VERTEX;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_48,&local_4c);
  *ppcVar2 = "vulkan/draw/VertexFetch.vert";
  local_60[0] = SHADERTYPE_FRAGMENT;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_48,local_60);
  *ppcVar2 = "vulkan/draw/VertexFetch.frag";
  testSpec.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 3;
  pIVar3 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *)operator_new(0xa8);
  local_e9 = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"draw_indexed_triangle_list",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Draws indexed triangle list",&local_a9);
  TestSpecBase::TestSpecBase(&local_e8,(TestSpecBase *)local_48);
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed>::InstanceFactory
            (pIVar3,pTVar1,&local_80,&local_a8,&local_e8);
  local_e9 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar3);
  TestSpecBase::~TestSpecBase(&local_e8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  testSpec.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4;
  pIVar3 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed> *)operator_new(0xa8);
  testSpec_1._55_1_ = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"draw_indexed_triangle_strip",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Draws indexed triangle strip",&local_139);
  TestSpecBase::TestSpecBase(&local_178,(TestSpecBase *)local_48);
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawIndexed>::InstanceFactory
            (pIVar3,pTVar1,&local_110,&local_138,&local_178);
  testSpec_1._55_1_ = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar3);
  TestSpecBase::~TestSpecBase(&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  TestSpecBase::~TestSpecBase((TestSpecBase *)local_48);
  TestSpecBase::TestSpecBase((TestSpecBase *)local_1b8);
  local_1c0[1] = 0;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_1b8,local_1c0 + 1);
  *ppcVar2 = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
  local_1c0[0] = SHADERTYPE_FRAGMENT;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_1b8,local_1c0);
  *ppcVar2 = "vulkan/draw/VertexFetch.frag";
  testSpec_1.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 3;
  pIVar4 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed> *)
           operator_new(0xa8);
  local_249 = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"draw_instanced_indexed_triangle_list",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Draws indexed triangle list",&local_209);
  TestSpecBase::TestSpecBase(&local_248,(TestSpecBase *)local_1b8);
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed>::InstanceFactory
            (pIVar4,pTVar1,&local_1e0,&local_208,&local_248);
  local_249 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
  TestSpecBase::~TestSpecBase(&local_248);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  testSpec_1.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4;
  pIVar4 = (InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed> *)
           operator_new(0xa8);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"draw_instanced_indexed_triangle_strip",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Draws indexed triangle strip",&local_299);
  TestSpecBase::TestSpecBase(&local_2d8,(TestSpecBase *)local_1b8);
  InstanceFactory<vkt::Draw::(anonymous_namespace)::DrawInstancedIndexed>::InstanceFactory
            (pIVar4,pTVar1,&local_270,&local_298,&local_2d8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
  TestSpecBase::~TestSpecBase(&local_2d8);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  TestSpecBase::~TestSpecBase((TestSpecBase *)local_1b8);
  return extraout_EAX;
}

Assistant:

void DrawIndexedTests::init (void)
{
	{
		DrawIndexed::TestSpec testSpec;
		testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetch.vert";
		testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		addChild(new InstanceFactory<DrawIndexed>(m_testCtx, "draw_indexed_triangle_list", "Draws indexed triangle list", testSpec));
		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
		addChild(new InstanceFactory<DrawIndexed>(m_testCtx, "draw_indexed_triangle_strip", "Draws indexed triangle strip", testSpec));
	}
	{
		DrawInstancedIndexed::TestSpec testSpec;
		testSpec.shaders[glu::SHADERTYPE_VERTEX] = "vulkan/draw/VertexFetchInstancedFirstInstance.vert";
		testSpec.shaders[glu::SHADERTYPE_FRAGMENT] = "vulkan/draw/VertexFetch.frag";

		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		addChild(new InstanceFactory<DrawInstancedIndexed>(m_testCtx, "draw_instanced_indexed_triangle_list", "Draws indexed triangle list", testSpec));
		testSpec.topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
		addChild(new InstanceFactory<DrawInstancedIndexed>(m_testCtx, "draw_instanced_indexed_triangle_strip", "Draws indexed triangle strip", testSpec));
	}
}